

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand
          (MoveMemFromConstCommand *this,CTemp *target,int constant)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017cf60;
  std::__cxx11::string::string((string *)&this->target,(string *)target);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand( const IRT::CTemp &target, int constant ) : target(
        target ), constant( constant ) { }